

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O1

type rest_rpc::rpc_service::router::
     call_helper<void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&,std::__cxx11::string_const&),0ul,1ul,std::__cxx11::string,std::__cxx11::string>
               (_func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                **f,index_sequence<0UL,_1UL> *param_2,
               tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *tup,weak_ptr<rest_rpc::rpc_service::connection> *ptr)

{
  undefined1 *puVar1;
  _Atomic_word *p_Var2;
  _func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *p_Var3;
  int iVar4;
  weak_ptr<rest_rpc::rpc_service::connection> wVar5;
  element_type *local_18;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  p_Var3 = *f;
  local_18 = (ptr->super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_10._M_pi =
       (ptr->super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar1 = (undefined1 *)
               ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_10._M_pi)->_M_string_length + 4);
      *(int *)puVar1 = *(int *)puVar1 + 1;
      UNLOCK();
    }
    else {
      puVar1 = (undefined1 *)
               ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_10._M_pi)->_M_string_length + 4);
      *(int *)puVar1 = *(int *)puVar1 + 1;
    }
  }
  wVar5.super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          &(tup->
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ;
  wVar5.super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffe8;
  (*p_Var3)(wVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tup,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10._M_pi);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &(local_10._M_pi)->_M_weak_count;
      iVar4 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar4 = (local_10._M_pi)->_M_weak_count;
      (local_10._M_pi)->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (**(code **)(((_Alloc_hider *)&(local_10._M_pi)->_vptr__Sp_counted_base)->_M_p + 0x18))();
    }
  }
  return;
}

Assistant:

static typename std::result_of<F(std::weak_ptr<connection>, Args...)>::type
  call_helper(const F &f, const nonstd::index_sequence<I...> &,
              std::tuple<Args...> tup, std::weak_ptr<connection> ptr) {
    return f(ptr, std::move(std::get<I>(tup))...);
  }